

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O2

void __thiscall
basist::dxt5a_block::set_selector(dxt5a_block *this,uint32_t x,uint32_t y,uint32_t val)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  
  if (((y | x) < 4) && (val < 8)) {
    uVar3 = x + y * 4;
    uVar2 = (ulong)(uVar3 * 3 >> 3);
    bVar1 = (byte)(uVar3 * 3) & 7;
    uVar4 = (uint)this->m_selectors[uVar2];
    if (uVar3 < 0xe) {
      uVar4 = (uint)CONCAT11(this->m_selectors[uVar2 + 1],this->m_selectors[uVar2]);
    }
    uVar4 = val << bVar1 | ~(7 << bVar1) & uVar4;
    this->m_selectors[uVar2] = (uint8_t)uVar4;
    if (uVar3 < 0xe) {
      this->m_selectors[uVar2 + 1] = (uint8_t)(uVar4 >> 8);
    }
    return;
  }
  __assert_fail("(x < 4U) && (y < 4U) && (val < 8U)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                ,0xa44,"void basist::dxt5a_block::set_selector(uint32_t, uint32_t, uint32_t)");
}

Assistant:

inline void set_selector(uint32_t x, uint32_t y, uint32_t val)
		{
			assert((x < 4U) && (y < 4U) && (val < 8U));

			uint32_t selector_index = (y * 4) + x;
			uint32_t bit_index = selector_index * cDXT5SelectorBits;

			uint32_t byte_index = bit_index >> 3;
			uint32_t bit_ofs = bit_index & 7;

			uint32_t v = m_selectors[byte_index];
			if (byte_index < (cTotalSelectorBytes - 1))
				v |= (m_selectors[byte_index + 1] << 8);

			v &= (~(7 << bit_ofs));
			v |= (val << bit_ofs);

			m_selectors[byte_index] = static_cast<uint8_t>(v);
			if (byte_index < (cTotalSelectorBytes - 1))
				m_selectors[byte_index + 1] = static_cast<uint8_t>(v >> 8);
		}